

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

void Cba_ManGetClpStats_rec(Cba_Ntk_t *p,int *pCountN,int *pCountI,int *pCountO)

{
  int iVar1;
  Cba_ObjType_t CVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Cba_Ntk_t *p_00;
  int i;
  
  iVar1 = p->Id;
  if (pCountN[iVar1] < 0) {
    pCountO[iVar1] = 0;
    pCountI[iVar1] = 0;
    pCountN[iVar1] = 0;
    for (i = 1; i < (p->vObjType).nSize; i = i + 1) {
      CVar2 = Cba_ObjType(p,i);
      if (CVar2 != CBA_OBJ_NONE) {
        iVar3 = Cba_ObjIsBoxPrim(p,i);
        if (iVar3 == 0) {
          iVar3 = Cba_ObjIsBoxUser(p,i);
          if (iVar3 == 0) goto LAB_0032eb6f;
          iVar4 = Cba_ObjNtkId(p,i);
          p_00 = Cba_ObjNtk(p,i);
          Cba_ManGetClpStats_rec(p_00,pCountN,pCountI,pCountO);
          iVar3 = pCountN[iVar4];
          iVar5 = Cba_ObjFonNum(p,i);
          pCountN[iVar1] = pCountN[iVar1] + iVar5 + iVar3;
          iVar3 = pCountI[iVar4];
          iVar5 = Cba_ObjFonNum(p,i);
          pCountI[iVar1] = pCountI[iVar1] + iVar5 + iVar3;
          iVar3 = pCountO[iVar4];
          iVar4 = Cba_ObjFonNum(p,i);
          iVar4 = iVar4 + iVar3;
        }
        else {
          pCountN[iVar1] = pCountN[iVar1] + 1;
          iVar3 = Cba_ObjFinNum(p,i);
          pCountI[iVar1] = pCountI[iVar1] + iVar3;
          iVar4 = Cba_ObjFonNum(p,i);
        }
        pCountO[iVar1] = iVar4 + pCountO[iVar1];
      }
LAB_0032eb6f:
    }
  }
  return;
}

Assistant:

void Cba_ManGetClpStats_rec( Cba_Ntk_t * p, int * pCountN, int * pCountI, int * pCountO )
{
    int iObj, Id = Cba_NtkId(p);
    if ( pCountN[Id] >= 0 )
        return;
    pCountN[Id] = pCountI[Id] = pCountO[Id] = 0;
    Cba_NtkForEachObj( p, iObj )
        if ( Cba_ObjIsBoxPrim(p, iObj) )
        {
            pCountN[Id] += 1;
            pCountI[Id] += Cba_ObjFinNum(p, iObj);
            pCountO[Id] += Cba_ObjFonNum(p, iObj);
        }
        else if ( Cba_ObjIsBoxUser(p, iObj) )
        {
            int NtkId = Cba_ObjNtkId(p, iObj);
            Cba_ManGetClpStats_rec( Cba_ObjNtk(p, iObj), pCountN, pCountI, pCountO );
            pCountN[Id] += pCountN[NtkId] + Cba_ObjFonNum(p, iObj);
            pCountI[Id] += pCountI[NtkId] + Cba_ObjFonNum(p, iObj);
            pCountO[Id] += pCountO[NtkId] + Cba_ObjFonNum(p, iObj);
        }
}